

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Protector.cpp
# Opt level: O1

Message * __thiscall
CppUnit::Protector::actualMessage
          (Message *__return_storage_ptr__,Protector *this,Message *message,
          ProtectorContext *context)

{
  string *detail1;
  Message local_90;
  
  Message::Message(__return_storage_ptr__);
  if ((context->m_shortDescription)._M_string_length == 0) {
    Message::operator=(__return_storage_ptr__,message);
  }
  else {
    detail1 = Message::shortDescription_abi_cxx11_(message);
    Message::Message(&local_90,&context->m_shortDescription,detail1);
    Message::operator=(__return_storage_ptr__,&local_90);
    Message::~Message(&local_90);
    Message::addDetail(__return_storage_ptr__,message);
  }
  return __return_storage_ptr__;
}

Assistant:

Message 
Protector::actualMessage( const Message &message,
                          const ProtectorContext &context ) const
{
  Message theActualMessage;
  if ( context.m_shortDescription.empty() )
    theActualMessage = message;
  else
  {
    theActualMessage = Message( context.m_shortDescription, 
                                message.shortDescription() );
    theActualMessage.addDetail( message );
  }

  return theActualMessage;
}